

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_rejected(REJECTED_HANDLE rejected)

{
  REJECTED_INSTANCE *rejected_instance;
  AMQP_VALUE result;
  REJECTED_HANDLE rejected_local;
  
  if (rejected == (REJECTED_HANDLE)0x0) {
    rejected_instance = (REJECTED_INSTANCE *)0x0;
  }
  else {
    rejected_instance = (REJECTED_INSTANCE *)amqpvalue_clone(rejected->composite_value);
  }
  return (AMQP_VALUE)rejected_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_rejected(REJECTED_HANDLE rejected)
{
    AMQP_VALUE result;

    if (rejected == NULL)
    {
        result = NULL;
    }
    else
    {
        REJECTED_INSTANCE* rejected_instance = (REJECTED_INSTANCE*)rejected;
        result = amqpvalue_clone(rejected_instance->composite_value);
    }

    return result;
}